

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

string * __thiscall
flatbuffers::FlatCompiler::GetUsageString
          (string *__return_storage_ptr__,FlatCompiler *this,string *program_name)

{
  bool bVar1;
  ostream *poVar2;
  reference option_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  string files_description;
  FlatCOption *option_1;
  FlatCOption *__end1_1;
  FlatCOption *__begin1_1;
  FlatCOption (*__range1_1) [90];
  FlatCOption *option;
  iterator __end1;
  iterator __begin1;
  set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_google[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
  *__range1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  string *local_20;
  string *program_name_local;
  FlatCompiler *this_local;
  
  local_20 = program_name;
  program_name_local = (string *)this;
  this_local = (FlatCompiler *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"Usage: ");
  poVar2 = std::operator<<(poVar2,(string *)local_20);
  std::operator<<(poVar2," [OPTION]... FILE... [-- BINARY_FILE...]\n");
  __end1 = std::
           set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/flatc.cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
           ::begin((set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_google[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
                    *)language_options);
  option = (FlatCOption *)
           std::
           set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/flatc.cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
           ::end((set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_google[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
                  *)language_options);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&option);
    if (!bVar1) break;
    option_00 = std::_Rb_tree_const_iterator<flatbuffers::FlatCOption>::operator*(&__end1);
    AppendOption((stringstream *)local_1a8,option_00,0x50,0x19);
    std::_Rb_tree_const_iterator<flatbuffers::FlatCOption>::operator++(&__end1);
  }
  std::operator<<(local_198,"\n");
  for (__end1_1 = (FlatCOption *)flatc_options; __end1_1 != (FlatCOption *)language_options;
      __end1_1 = __end1_1 + 1) {
    files_description.field_2._8_8_ = __end1_1;
    AppendOption((stringstream *)local_1a8,__end1_1,0x50,0x19);
  }
  std::operator<<(local_198,"\n");
  std::operator+(&local_238,
                 "FILEs may be schemas (must end in .fbs), binary schemas (must end in .bfbs) or JSON files (conforming to preceding schema). BINARY_FILEs after the -- must be binary flatbuffer format files. Output files are named using the base file name of the input, and written to the current directory or the path given by -o. example: "
                 ,local_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 &local_238," -c -b schema1.fbs schema2.fbs data.json");
  std::__cxx11::string::~string((string *)&local_238);
  AppendTextWrappedString((stringstream *)local_1a8,(string *)local_218,0x50,0);
  std::operator<<(local_198,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string FlatCompiler::GetUsageString(
    const std::string &program_name) const {
  std::stringstream ss;
  ss << "Usage: " << program_name
     << " [OPTION]... FILE... [-- BINARY_FILE...]\n";

  for (const FlatCOption &option : language_options) {
    AppendOption(ss, option, 80, 25);
  }
  ss << "\n";

  for (const FlatCOption &option : flatc_options) {
    AppendOption(ss, option, 80, 25);
  }
  ss << "\n";

  std::string files_description =
      "FILEs may be schemas (must end in .fbs), binary schemas (must end in "
      ".bfbs) or JSON files (conforming to preceding schema). BINARY_FILEs "
      "after the -- must be binary flatbuffer format files. Output files are "
      "named using the base file name of the input, and written to the current "
      "directory or the path given by -o. example: " +
      program_name + " -c -b schema1.fbs schema2.fbs data.json";
  AppendTextWrappedString(ss, files_description, 80, 0);
  ss << "\n";
  return ss.str();
}